

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O0

bool Diligent::PRSSerializer<(Diligent::SerializerMode)1>::SerializeDesc
               (Serializer<(Diligent::SerializerMode)1> *Ser,
               ConstQual<PipelineResourceSignatureDesc> *Desc,DynamicLinearAllocator *Allocator)

{
  bool bVar1;
  DynamicLinearAllocator *Allocator_local;
  ConstQual<PipelineResourceSignatureDesc> *Desc_local;
  Serializer<(Diligent::SerializerMode)1> *Ser_local;
  
  bVar1 = Serializer<(Diligent::SerializerMode)1>::operator()
                    (Ser,&Desc->BindingIndex,&Desc->UseCombinedTextureSamplers,
                     &Desc->CombinedSamplerSuffix);
  if (bVar1) {
    bVar1 = Serializer<(Diligent::SerializerMode)1>::
            SerializeArray<Diligent::PipelineResourceDesc_const*const,unsigned_int_const,Diligent::PRSSerializer<(Diligent::SerializerMode)1>::SerializeDesc(Diligent::Serializer<(Diligent::SerializerMode)1>&,Diligent::PipelineResourceSignatureDesc_const&,Diligent::DynamicLinearAllocator*)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)1>&,Diligent::PipelineResourceDesc_const&)_1_>
                      (Ser,Allocator,&Desc->Resources,&Desc->NumResources);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Ser_local._7_1_ =
           Serializer<(Diligent::SerializerMode)1>::
           SerializeArray<Diligent::ImmutableSamplerDesc_const*const,unsigned_int_const,bool(*)(Diligent::Serializer<(Diligent::SerializerMode)1>&,Diligent::ImmutableSamplerDesc_const&)>
                     (Ser,Allocator,&Desc->ImmutableSamplers,&Desc->NumImmutableSamplers,
                      SerializeImmutableSampler<(Diligent::SerializerMode)1>);
    }
    else {
      Ser_local._7_1_ = false;
    }
  }
  else {
    Ser_local._7_1_ = false;
  }
  return Ser_local._7_1_;
}

Assistant:

bool PRSSerializer<Mode>::SerializeDesc(
    Serializer<Mode>&                         Ser,
    ConstQual<PipelineResourceSignatureDesc>& Desc,
    DynamicLinearAllocator*                   Allocator)
{
    // Serialize PipelineResourceSignatureDesc
    if (!Ser(Desc.BindingIndex,
             Desc.UseCombinedTextureSamplers,
             Desc.CombinedSamplerSuffix))
        return false;
    // skip Name
    // skip SRBAllocationGranularity

    if (!Ser.SerializeArray(Allocator, Desc.Resources, Desc.NumResources,
                            [](Serializer<Mode>&                Ser,
                               ConstQual<PipelineResourceDesc>& ResDesc) //
                            {
                                return Ser(ResDesc.Name,
                                           ResDesc.ShaderStages,
                                           ResDesc.ArraySize,
                                           ResDesc.ResourceType,
                                           ResDesc.VarType,
                                           ResDesc.Flags,
                                           ResDesc.WebGPUAttribs.BindingType,
                                           ResDesc.WebGPUAttribs.TextureViewDim,
                                           ResDesc.WebGPUAttribs.UAVTextureFormat);
                            }))
        return false;

    return Ser.SerializeArray(Allocator, Desc.ImmutableSamplers, Desc.NumImmutableSamplers, SerializeImmutableSampler<Mode>);

    ASSERT_SIZEOF64(PipelineResourceSignatureDesc, 56, "Did you add a new member to PipelineResourceSignatureDesc? Please add serialization here.");
    ASSERT_SIZEOF64(PipelineResourceDesc, 24, "Did you add a new member to PipelineResourceDesc? Please add serialization here.");
}